

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

errr finish_parse_artifact(parser *p)

{
  ushort uVar1;
  void *pvVar2;
  undefined8 *puVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  void *pvVar6;
  object *poVar7;
  uint16_t uVar8;
  object_kind *poVar9;
  bitflag *pbVar10;
  ulong uVar11;
  curse *pcVar12;
  long lVar13;
  
  z_info->a_max = 0;
  pvVar6 = parser_priv(p);
  uVar8 = z_info->a_max;
  if (pvVar6 != (void *)0x0) {
    do {
      uVar8 = uVar8 + 1;
      pvVar6 = *(void **)((long)pvVar6 + 0x18);
    } while (pvVar6 != (void *)0x0);
    z_info->a_max = uVar8;
  }
  a_info = (artifact *)mem_zalloc((ulong)((uint)uVar8 * 0x140) + 0x140);
  aup_info = (artifact_upkeep *)mem_zalloc((ulong)z_info->a_max * 8 + 8);
  uVar1 = z_info->a_max;
  uVar11 = (ulong)uVar1;
  pvVar6 = parser_priv(p);
  if (pvVar6 != (void *)0x0) {
    lVar13 = (ulong)(((uint)uVar1 * 4 + (uint)uVar1) * 0x40) + 0x140;
    do {
      if ((long)uVar11 < 1) {
        __assert_fail("aidx > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                      ,0xbff,"errr finish_parse_artifact(struct parser *)");
      }
      memcpy(a_info[-1].flags + lVar13 + -0x48,pvVar6,0x140);
      *(uint32_t *)((long)a_info + lVar13 + -0x130) = (uint32_t)uVar11;
      pvVar2 = *(void **)((long)pvVar6 + 0x18);
      pbVar10 = a_info->flags + lVar13 + -0x48;
      if (z_info->a_max <= uVar11) {
        pbVar10 = (bitflag *)0x0;
      }
      *(bitflag **)((long)a_info + lVar13 + -0x128) = pbVar10;
      mem_free(pvVar6);
      aup_info[uVar11].aidx = (uint32_t)uVar11;
      uVar11 = uVar11 - 1;
      lVar13 = lVar13 + -0x140;
      pvVar6 = pvVar2;
    } while (pvVar2 != (void *)0x0);
  }
  z_info->a_max = z_info->a_max + 1;
  wVar4 = tval_find_idx("none");
  wVar5 = lookup_sval(wVar4,"<unknown item>");
  unknown_item_kind = lookup_kind(wVar4,wVar5);
  wVar5 = lookup_sval(wVar4,"<unknown treasure>");
  unknown_gold_kind = lookup_kind(wVar4,wVar5);
  wVar5 = lookup_sval(wVar4,"<pile>");
  pile_kind = lookup_kind(wVar4,wVar5);
  wVar5 = lookup_sval(wVar4,"<curse object>");
  curse_object_kind = lookup_kind(wVar4,wVar5);
  wVar4 = tval_find_idx("none");
  wVar4 = lookup_sval(wVar4,"<curse object>");
  if (1 < z_info->curse_max) {
    uVar11 = 1;
    lVar13 = 0x50;
    poVar9 = curse_object_kind;
    pcVar12 = curses;
    do {
      puVar3 = *(undefined8 **)(pcVar12->conflict_flags + lVar13 + -0x28);
      *puVar3 = poVar9;
      *(char *)((long)puVar3 + 0x3d) = (char)wVar4;
      poVar7 = (object *)puVar3[5];
      if (poVar7 == (object *)0x0) {
        poVar7 = object_new();
        *(object **)(*(long *)(pcVar12->conflict_flags + lVar13 + -0x28) + 0x28) = poVar7;
      }
      poVar9 = curse_object_kind;
      poVar7->kind = curse_object_kind;
      pcVar12 = curses;
      *(char *)(*(long *)(*(long *)(curses->conflict_flags + lVar13 + -0x28) + 0x28) + 0x3d) =
           (char)wVar4;
      poVar7->notice = poVar7->notice | 2;
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + 0x38;
    } while (uVar11 < z_info->curse_max);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_artifact(struct parser *p) {
	struct artifact *a, *n;
	int none, aidx;

	/* Scan the list for the max id */
	z_info->a_max = 0;
	a = parser_priv(p);
	while (a) {
		z_info->a_max++;
		a = a->next;
	}

	/* Allocate the direct access list and copy the data to it */
	a_info = mem_zalloc((z_info->a_max + 1) * sizeof(*a));
	aup_info = mem_zalloc((z_info->a_max + 1) * sizeof(*aup_info));
	aidx = z_info->a_max;
	for (a = parser_priv(p); a; a = n, aidx--) {
		assert(aidx > 0);

		memcpy(&a_info[aidx], a, sizeof(*a));
		a_info[aidx].aidx = aidx;
		n = a->next;
		a_info[aidx].next = (aidx < z_info->a_max) ?
			&a_info[aidx + 1] : NULL;
		mem_free(a);

		aup_info[aidx].aidx = aidx;
	}
	z_info->a_max += 1;

	/* Now we're done with object kinds, deal with object-like things */
	none = tval_find_idx("none");
	unknown_item_kind = lookup_kind(none, lookup_sval(none, "<unknown item>"));
	unknown_gold_kind = lookup_kind(none,
									lookup_sval(none, "<unknown treasure>"));
	pile_kind = lookup_kind(none, lookup_sval(none, "<pile>"));
	curse_object_kind = lookup_kind(none, lookup_sval(none, "<curse object>"));
	write_curse_kinds();
	parser_destroy(p);
	return 0;
}